

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O2

void frame(void)

{
  uchar *puVar1;
  size_t sVar2;
  uint __i;
  int iVar3;
  long lVar4;
  int *piVar5;
  mutex *__readfds;
  thread tStack_128;
  fd_set *pfStack_120;
  timeval tv;
  ulong local_108 [11];
  fd_set fds;
  
  __readfds = (mutex *)&fds;
  do {
    while( true ) {
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        fds.fds_bits[lVar4] = 0;
      }
      fds.fds_bits[fd / 0x40] = fds.fds_bits[fd / 0x40] | 1L << ((byte)fd & 0x3f);
      tv.tv_sec = 2;
      tv.tv_usec = 0;
      pfStack_120 = (fd_set *)0x1156df;
      iVar3 = select(fd + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
      if (iVar3 != -1) break;
      pfStack_120 = (fd_set *)0x115763;
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        pfStack_120 = (fd_set *)0x115778;
        errno_exit("select");
LAB_00115778:
        if ((uint)local_108[0] < n_buffers) {
          puVar1 = (uchar *)buffers[local_108[0] & 0xffffffff].start;
          if (Webcam::isStreamMode == true) {
            sVar2 = buffers[local_108[0] & 0xffffffff].length;
            __readfds = &imgLock;
            pfStack_120 = (fd_set *)0x1157b6;
            std::mutex::lock(&imgLock);
            imgBuffer[1 - (long)readyImgPos].data = puVar1;
            imgBuffer[1 - (long)readyImgPos].size = (int)sVar2;
            readyImgPos = 1 - readyImgPos;
            pfStack_120 = (fd_set *)0x1157f9;
            pthread_mutex_unlock((pthread_mutex_t *)&imgLock);
            puVar1 = imgBuffer[0].data;
          }
          imgBuffer[0].data = puVar1;
          pfStack_120 = (fd_set *)0x115817;
          iVar3 = xioctl(fd,-0x3fa7a9f1,local_108);
          if (iVar3 == -1) {
            pfStack_120 = (fd_set *)0x115889;
            errno_exit("VIDIOC_QBUF");
            LOCK();
            isRun._M_base._M_i = (__atomic_base<bool>)true;
            UNLOCK();
            Webcam::isStreamMode = true;
            pfStack_120 = (fd_set *)__readfds;
            std::thread::thread<void(&)(),,void>(&tStack_128,autoframe);
            std::thread::operator=(&frameThread,&tStack_128);
            std::thread::~thread(&tStack_128);
            return;
          }
          return;
        }
        goto LAB_0011585e;
      }
    }
    if (iVar3 == 0) {
      pfStack_120 = (fd_set *)0x11584a;
      fwrite("select timeout\n",0xf,1,_stderr);
      pfStack_120 = (fd_set *)0x115852;
      exit(1);
    }
    read_frame()::count = read_frame()::count + 1;
    pfStack_120 = (fd_set *)0x115709;
    printf("%d\n");
    local_108[1] = 0;
    local_108[6] = 0;
    local_108[2] = 0;
    local_108[3] = 0;
    local_108[4] = 0;
    local_108[5] = 0;
    local_108[10] = 0;
    local_108[8] = 0;
    local_108[9] = 0;
    local_108[0] = 0x100000000;
    local_108[7] = 0x100000000;
    pfStack_120 = (fd_set *)0x115746;
    iVar3 = xioctl(fd,-0x3fa7a9ef,local_108);
    if (iVar3 != -1) goto LAB_00115778;
    pfStack_120 = (fd_set *)0x115750;
    piVar5 = __errno_location();
  } while (*piVar5 == 0xb);
  pfStack_120 = (fd_set *)0x11585e;
  errno_exit("VIDIOC_DQBUF");
LAB_0011585e:
  pfStack_120 = (fd_set *)0x11587d;
  __assert_fail("buf.index < n_buffers",
                "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/usbcam.cpp"
                ,0x8d,"int read_frame()");
}

Assistant:

static void
frame                        (void)
{
    for (;;) {
        fd_set fds;
        struct timeval tv;
        int r;

        FD_ZERO (&fds);
        FD_SET (fd, &fds);

        /* Timeout. */
        tv.tv_sec = 2;
        tv.tv_usec = 0;

        r = select (fd + 1, &fds, NULL, NULL, &tv);

        if (-1 == r) {
            if (EINTR == errno)
                continue;

            errno_exit ("select");
        }

        if (0 == r) {
            fprintf (stderr, "select timeout\n");
            errno_exit (EXIT_FAILURE);
        }

        if (read_frame ())
            break;

        /* EAGAIN - continue select loop. */
    }
}